

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionBody::IsGeneratorAndJitIsDisabled(FunctionBody *this)

{
  bool bVar1;
  undefined1 local_21;
  undefined1 local_11;
  FunctionBody *this_local;
  
  bVar1 = FunctionProxy::IsCoroutine((FunctionProxy *)this);
  local_11 = 0;
  if (bVar1) {
    local_21 = 0;
    if ((DAT_01ea4188 & 1) != 0) {
      bVar1 = ParseableFunctionInfo::GetHasTry(&this->super_ParseableFunctionInfo);
      local_21 = 0;
      if (!bVar1) {
        bVar1 = FunctionProxy::IsInDebugMode((FunctionProxy *)this);
        local_21 = 0;
        if (!bVar1) {
          bVar1 = FunctionProxy::IsModule((FunctionProxy *)this);
          local_21 = bVar1 ^ 0xff;
        }
      }
    }
    local_11 = local_21 ^ 0xff;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool
    FunctionBody::IsGeneratorAndJitIsDisabled() const
    {
        return this->IsCoroutine() && !(CONFIG_FLAG(JitES6Generators) && !this->GetHasTry() && !this->IsInDebugMode() && !this->IsModule());
    }